

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCheckedActualCall_unExpectedCallWithAParameter_Test::testBody
          (TEST_MockCheckedActualCall_unExpectedCallWithAParameter_Test *this)

{
  MockActualCall *this_00;
  UtestShell *test;
  SimpleString local_110;
  undefined1 local_100 [8];
  MockUnexpectedCallHappenedFailure expectedFailure;
  SimpleString local_78;
  undefined1 local_68 [8];
  MockCheckedActualCall actualCall;
  TEST_MockCheckedActualCall_unExpectedCallWithAParameter_Test *this_local;
  
  actualCall.outputParameterExpectations_ = (MockOutputParametersListNode *)this;
  MockCheckedActualCall::MockCheckedActualCall
            ((MockCheckedActualCall *)local_68,1,
             (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).reporter,
             (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).emptyList);
  SimpleString::SimpleString(&local_78,"unexpected");
  this_00 = MockCheckedActualCall::withName((MockCheckedActualCall *)local_68,&local_78);
  SimpleString::SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_,"bar");
  MockActualCall::withParameter
            (this_00,(SimpleString *)
                     &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_,0);
  SimpleString::~SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  SimpleString::~SimpleString(&local_78);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_110,"unexpected");
  MockUnexpectedCallHappenedFailure::MockUnexpectedCallHappenedFailure
            ((MockUnexpectedCallHappenedFailure *)local_100,test,&local_110,
             (this->super_TEST_GROUP_CppUTestGroupMockCheckedActualCall).list);
  SimpleString::~SimpleString(&local_110);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)local_100,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
             ,0x4a);
  MockUnexpectedCallHappenedFailure::~MockUnexpectedCallHappenedFailure
            ((MockUnexpectedCallHappenedFailure *)local_100);
  MockCheckedActualCall::~MockCheckedActualCall((MockCheckedActualCall *)local_68);
  return;
}

Assistant:

TEST(MockCheckedActualCall, unExpectedCallWithAParameter)
{
    MockCheckedActualCall actualCall(1, reporter, *emptyList);
    actualCall.withName("unexpected").withParameter("bar", 0);

    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "unexpected", *list);
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}